

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservableDictionaryExample.cpp
# Opt level: O2

void __thiscall Random::Random(Random *this)

{
  uint uVar1;
  
  std::random_device::random_device(&this->_rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->_mt,(ulong)uVar1);
  (this->_dist)._M_param._M_a = 1.0;
  (this->_dist)._M_param._M_b = 10.0;
  return;
}

Assistant:

Random()
        : _mt(_rd()), _dist(1.0, 10.0)
    { }